

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O2

void __thiscall chrono::ChBezierCurve::ArchiveOUT(ChBezierCurve *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_c0;
  ChNameValue<double> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<unsigned_long> local_78;
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_60;
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_48;
  ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChBezierCurve>(marchive);
  local_30._name = "m_points";
  local_30._flags = '\0';
  local_30._value = &this->m_points;
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->m_inCV;
  local_48._name = "m_inCV";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->m_outCV;
  local_60._name = "m_outCV";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._name = "m_maxNumIters";
  local_78._value = &m_maxNumIters;
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._name = "m_sqrDistTol";
  local_90._value = (double *)&m_sqrDistTol;
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._name = "m_cosAngleTol";
  local_a8._value = (double *)&m_cosAngleTol;
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  local_c0._name = "m_paramTol";
  local_c0._value = (double *)&m_paramTol;
  local_c0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_c0);
  return;
}

Assistant:

void ChBezierCurve::ArchiveOUT(ChArchiveOut& marchive)
{
    // version number
    marchive.VersionWrite<ChBezierCurve>();

    // serialize all member data:
    marchive << CHNVP(m_points);
    marchive << CHNVP(m_inCV);
    marchive << CHNVP(m_outCV);
    marchive << CHNVP(m_maxNumIters);
    marchive << CHNVP(m_sqrDistTol);
    marchive << CHNVP(m_cosAngleTol);
    marchive << CHNVP(m_paramTol);
}